

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,4,1,true>,_1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *this,
          VectorBlock<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1> *essential
          ,Scalar *tau,Scalar *workspace)

{
  double *pdVar1;
  double dVar2;
  long lVar3;
  PointerType pdVar4;
  PointerType pdVar5;
  variable_if_dynamic<long,__1> vVar6;
  scalar_multiple_op<double> sVar7;
  uint uVar8;
  long lVar9;
  char *__function;
  type tVar10;
  Index col;
  double dVar11;
  variable_if_dynamic<long,__1> *pvVar12;
  type tVar13;
  variable_if_dynamic<long,__1> *pvVar14;
  Index innerSize;
  type tVar15;
  uint uVar16;
  Index othersize_1;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>_>
  tmp_3;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> tmp_1;
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false> bottom;
  SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_4,_4>_>_>
  tmp;
  scalar_difference_op<double> local_289;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>> *local_288;
  VectorBlock<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1> *local_280;
  double *local_278;
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
  local_270;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> local_260;
  Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false> local_240;
  undefined1 local_1f8 [48];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *pMStack_1c8;
  long local_1c0;
  variable_if_dynamic<long,__1> local_1b8 [2];
  double local_1a8;
  double local_148;
  DenseIndex local_128;
  DenseIndex DStack_120;
  undefined1 local_118 [8];
  SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
  *local_110;
  variable_if_dynamic<long,__1> local_108;
  scalar_multiple_op<double> local_f8;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *local_e8;
  ulong local_d8;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar9 = *(long *)(this + 8);
  if (lVar9 == 1) {
    local_1f8._16_8_ = 1.0 - *tau;
    local_110 = (SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
                 *)local_1f8;
    local_1f8._8_8_ = *(undefined8 *)(this + 0x10);
    local_1f8._0_8_ = 1;
    local_118 = (undefined1  [8])this;
    if (-1 < (long)local_1f8._8_8_) {
      SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_4,_4>_>_>
      ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_4,_4>_>_>
                   *)local_118,
                  (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,_4,_4>_>
                   *)local_1f8);
      return;
    }
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 0, 4, 4>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 0, 4, 4>]"
                 );
  }
  dVar2 = *(double *)(this + 0x10);
  local_260.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = workspace;
  local_260.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = (long)dVar2;
  if ((long)dVar2 < 0) {
    __assert_fail("vecSize >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                  ,0x8a,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, Level = 0]"
                 );
  }
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value = lVar9 - 1;
  lVar3 = *(long *)this;
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_data = (PointerType)(lVar3 + 8);
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = (long)dVar2;
  if ((long)((ulong)dVar2 |
            local_240.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
            .m_rows.m_value) < 0 &&
      local_240.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_data != (PointerType)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>, Level = 0]"
    ;
    goto LAB_0011c2bf;
  }
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.m_value
       = *(long *)(this + 0x10);
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
       *(Nested *)(this + 0x18);
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
       *(PointerType *)this;
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.m_value
       = *(long *)(this + 8);
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride =
       *(Index *)(this + 0x20);
  local_240.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
  .m_outerStride = *(Index *)(this + 0x20);
  local_278 = tau;
  if (lVar9 < 1) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 4, 4>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  local_1f8._8_8_ =
       (essential->
       super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
       .m_rows.m_value;
  local_1f8._0_8_ =
       (essential->
       super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
       .m_data;
  local_1f8._24_8_ =
       (essential->
       super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
       .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_0>.m_data;
  local_1f8._40_8_ =
       (essential->
       super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>).
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
       .m_xpr.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.m_xpr;
  pMStack_1c8 = (Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *)
                (essential->
                super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                ).
                super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                .m_xpr.
                super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_Eigen::Dense>.
                super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true,_true>.
                m_outerStride;
  local_1c0 = (essential->
              super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
              ).
              super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
              .m_outerStride;
  pvVar12 = (variable_if_dynamic<long,__1> *)&local_240;
  pvVar14 = local_1b8;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    pvVar14->m_value = pvVar12->m_value;
    pvVar12 = pvVar12 + 1;
    pvVar14 = pvVar14 + 1;
  }
  local_148 = 0.0;
  if (local_1f8._8_8_ !=
      local_240.
      super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_0>
      .m_rows.m_value) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/products/CoeffBasedProduct.h"
                  ,0x9e,
                  "Eigen::CoeffBasedProduct<const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>, 6>::CoeffBasedProduct(const Lhs &, const Rhs &) [Lhs = const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>>, Rhs = const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>, NestingFlags = 6, Lhs = Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>]"
                 );
  }
  if (dVar2 != local_1a8) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Assign.h"
                  ,0x1f9,
                  "Derived &Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Map<Eigen::Matrix<double, 1, -1, 1, 1, 4>>, OtherDerived = Eigen::CoeffBasedProduct<const Eigen::Transpose<const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>, 4, 1, true>, -1, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>>, 6>]"
                 );
  }
  local_280 = essential;
  if (dVar2 == 0.0) {
    local_1f8._16_8_ = 0.0;
    local_1f8._0_8_ = lVar3;
LAB_0011bfb6:
    pdVar1 = local_278;
    local_1c0 = *(long *)(this + 0x20);
    local_1f8._24_8_ = *(undefined8 *)this;
    local_1f8._32_8_ = *(undefined8 *)(this + 8);
    local_1f8._40_8_ = *(undefined8 *)(this + 0x10);
    pMStack_1c8 = *(Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> **)
                   (this + 0x18);
    local_1b8[0].m_value = 1;
    if (*(long *)(this + 8) < 1) {
LAB_0011c217:
      local_1b8[0].m_value = 1;
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                    ,0x76,
                    "Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, 4, 4>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                   );
    }
    local_118 = (undefined1  [8])&local_260;
    local_110 = &local_270;
    SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>_>
    ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>_>
                 *)local_118,
                (Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>
                 *)local_1f8);
    local_f8.m_other = *pdVar1;
    local_118 = (undefined1  [8])
                local_260.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    local_108.m_value =
         local_260.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_1f8._0_8_ = *(undefined8 *)this;
    local_1f8._16_8_ = *(undefined8 *)(this + 0x10);
    if (-1 < (long)local_1f8._16_8_ || local_1f8._0_8_ == 0) {
      local_1c0 = *(long *)(this + 0x20);
      local_1f8._24_8_ = *(undefined8 *)this;
      local_1f8._32_8_ = *(undefined8 *)(this + 8);
      local_1f8._40_8_ = *(undefined8 *)(this + 0x10);
      pMStack_1c8 = *(Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> **)
                     (this + 0x18);
      local_1b8[0].m_value = 1;
      if (0 < *(long *)(this + 8)) {
        local_270.m_matrix =
             (Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>
              *)local_1f8;
        local_270.m_functor = &local_289;
        SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_1,_-1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>_>
        ::operator=((SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1,__1,_false>,_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>_>
                     *)&local_270,
                    (CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>_>
                     *)local_118);
        vVar6.m_value =
             local_260.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value;
        pdVar5 = local_260.
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data;
        dVar2 = *pdVar1;
        pdVar4 = (local_280->
                 super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                 ).
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
                 .m_data;
        tVar15 = (type)(local_280->
                       super_Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>
                       ).
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>,_0>
                       .m_rows.m_value;
        local_f8.m_other = tVar15;
        if ((ulong)tVar15 < 5) {
          tVar10 = (type)(ulong)(SUB84(tVar15,0) & 6);
          if (1 < (ulong)tVar15) {
            tVar13 = 0.0;
            do {
              pdVar1 = pdVar4 + (long)tVar13;
              dVar11 = pdVar1[1];
              *(double *)(local_118 + (long)tVar13 * 8) = *pdVar1 * dVar2;
              (&local_110)[(long)tVar13] =
                   (SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
                    *)(dVar11 * dVar2);
              tVar13 = (type)((long)tVar13 + 2);
            } while ((ulong)tVar13 < (ulong)tVar10);
          }
          if ((long)tVar10 < (long)tVar15) {
            do {
              *(double *)(local_118 + (long)tVar10 * 8) = pdVar4[(long)tVar10] * dVar2;
              tVar10 = (type)((long)tVar10 + 1);
            } while (tVar15 != tVar10);
          }
          sVar7.m_other = local_f8.m_other;
          local_e8 = (Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *)
                     local_260.
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_data;
          local_d8 = local_260.
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_cols.m_value;
          local_48 = 0;
          uStack_40 = 0;
          local_1f8._32_8_ = local_f8.m_other;
          if ((ulong)local_f8.m_other < 5) {
            tVar15 = (type)(ulong)(SUB84(local_f8.m_other,0) & 6);
            if (1 < (ulong)local_f8.m_other) {
              memcpy(local_1f8,local_118,(long)tVar15 * 8);
            }
            if (tVar15 != sVar7.m_other) {
              uVar16 = (uint)((long)sVar7.m_other << 3);
              uVar8 = uVar16 & 0x30;
              memcpy(local_1f8 + uVar8,local_118 + uVar8,(ulong)(uVar16 & 8));
            }
            pMStack_1c8 = (Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_> *)
                          pdVar5;
            local_1b8[0].m_value = vVar6.m_value;
            local_128 = 0;
            DStack_120 = 0;
            local_270.m_matrix = &local_240;
            local_270.m_functor = &local_289;
            SelfCwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::CoeffBasedProduct<Eigen::Matrix<double,_-1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>_>
            ::operator=(&local_270,
                        (CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_4,_1>,_const_Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,_4>,_0,_Eigen::Stride<0,_0>_>,_256>
                         *)local_1f8);
            return;
          }
        }
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/PlainObjectBase.h"
                      ,0xf1,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 4, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 4, 1>]"
                     );
      }
      goto LAB_0011c217;
    }
  }
  else {
    dVar11 = 0.0;
    local_288 = this;
    do {
      internal::
      product_coeff_impl<0,_-1,_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_-1,_-1,_false>,_-1,_-1,_false>,_double>
      ::run(0,(Index)dVar11,
            (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_4,_1,_true>,__1,_1,_false>_>
             *)local_1f8,
            (Block<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,__1,__1,_false>
             *)local_1b8,(double *)local_118);
      workspace[(long)dVar11] = (Scalar)local_118;
      dVar11 = (double)((long)dVar11 + 1);
    } while (dVar2 != dVar11);
    local_1f8._0_8_ = *(undefined8 *)local_288;
    local_1f8._16_8_ = *(undefined8 *)(local_288 + 0x10);
    this = local_288;
    if (-1 < (long)local_1f8._16_8_ || local_1f8._0_8_ == 0) goto LAB_0011bfb6;
  }
  __function = 
  "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, 4, 4>>, 1>, Level = 0]"
  ;
LAB_0011c2bf:
  __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/MapBase.h"
                ,0x94,__function);
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}